

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O0

int lws_tls_client_create_vhost_context
              (lws_vhost *vh,lws_context_creation_info *info,char *cipher_list,char *ca_filepath,
              void *ca_mem,uint ca_mem_len,char *cert_filepath,void *cert_mem,uint cert_mem_len,
              char *private_key_filepath)

{
  void *pvVar1;
  int iVar2;
  lws_tls_extant lVar3;
  SSL_METHOD *pSVar4;
  char *pcVar5;
  EVP_MD_CTX *pEVar6;
  EVP_MD *type;
  size_t sVar7;
  int *piVar8;
  SSL_CTX *pSVar9;
  uint8_t *local_d0;
  uint8_t *up;
  uint8_t *up1;
  lws_filepos_t amount;
  lws_dll2 *tp;
  lws_dll2 *p;
  int n;
  char c;
  X509 *client_CA;
  uint8_t hash [32];
  uint local_6c;
  EVP_MD_CTX *pEStack_68;
  uint len;
  EVP_MD_CTX *mdctx;
  SSL_METHOD *method;
  unsigned_long error;
  X509_STORE *x509_store;
  lws_tls_client_reuse *tcr;
  char *pcStack_38;
  uint ca_mem_len_local;
  void *ca_mem_local;
  char *ca_filepath_local;
  char *cipher_list_local;
  lws_context_creation_info *info_local;
  lws_vhost *vh_local;
  
  tcr._4_4_ = ca_mem_len;
  pcStack_38 = (char *)ca_mem;
  ca_mem_local = ca_filepath;
  ca_filepath_local = cipher_list;
  cipher_list_local = (char *)info;
  info_local = (lws_context_creation_info *)vh;
  mdctx = (EVP_MD_CTX *)TLS_client_method();
  if (mdctx == (EVP_MD_CTX *)0x0) {
    pSVar4 = (SSL_METHOD *)ERR_get_error();
    method = pSVar4;
    pcVar5 = ERR_error_string((ulong)pSVar4,*(char **)((long)info_local->client_ssl_ca_mem + 0x2a8))
    ;
    _lws_log(1,"problem creating ssl method %lu: %s\n",pSVar4,pcVar5);
    vh_local._4_4_ = 1;
  }
  else {
    pEVar6 = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (pEVar6 == (EVP_MD_CTX *)0x0) {
      vh_local._4_4_ = 1;
    }
    else {
      pEStack_68 = pEVar6;
      type = EVP_sha256();
      iVar2 = EVP_DigestInit_ex(pEVar6,type,(ENGINE *)0x0);
      if (iVar2 == 1) {
        if (*(long *)(cipher_list_local + 0x1e8) != 0) {
          EVP_DigestUpdate(pEStack_68,cipher_list_local + 0x1e8,8);
        }
        if (*(long *)(cipher_list_local + 0x1f0) != 0) {
          EVP_DigestUpdate(pEStack_68,cipher_list_local + 0x1f0,8);
        }
        pcVar5 = ca_filepath_local;
        pEVar6 = pEStack_68;
        if (ca_filepath_local != (char *)0x0) {
          sVar7 = strlen(ca_filepath_local);
          EVP_DigestUpdate(pEVar6,pcVar5,sVar7);
        }
        pEVar6 = pEStack_68;
        if (*(long *)(cipher_list_local + 0x200) != 0) {
          pvVar1 = *(void **)(cipher_list_local + 0x200);
          sVar7 = strlen(*(char **)(cipher_list_local + 0x200));
          EVP_DigestUpdate(pEVar6,pvVar1,sVar7);
        }
        if (((ulong)info_local->client_ssl_ca_filepath & 0x40) != 0x40) {
          p._7_1_ = 1;
          EVP_DigestUpdate(pEStack_68,(void *)((long)&p + 7),1);
        }
        pvVar1 = ca_mem_local;
        pEVar6 = pEStack_68;
        if (ca_mem_local != (void *)0x0) {
          sVar7 = strlen((char *)ca_mem_local);
          EVP_DigestUpdate(pEVar6,pvVar1,sVar7);
        }
        pEVar6 = pEStack_68;
        if (cert_filepath != (char *)0x0) {
          sVar7 = strlen(cert_filepath);
          EVP_DigestUpdate(pEVar6,cert_filepath,sVar7);
        }
        pEVar6 = pEStack_68;
        if (private_key_filepath != (char *)0x0) {
          sVar7 = strlen(private_key_filepath);
          EVP_DigestUpdate(pEVar6,private_key_filepath,sVar7);
        }
        if ((pcStack_38 != (char *)0x0) && (tcr._4_4_ != 0)) {
          EVP_DigestUpdate(pEStack_68,pcStack_38,(ulong)tcr._4_4_);
        }
        if ((cert_mem != (void *)0x0) && (cert_mem_len != 0)) {
          EVP_DigestUpdate(pEStack_68,cert_mem,(ulong)cert_mem_len);
        }
        local_6c = 0x20;
        EVP_DigestFinal_ex(pEStack_68,(uchar *)&client_CA,&local_6c);
        EVP_MD_CTX_free(pEStack_68);
        tp = lws_dll2_get_head((lws_dll2_owner *)((long)info_local->client_ssl_ca_mem + 0x3a0));
        while (tp != (lws_dll2 *)0x0) {
          amount = (lws_filepos_t)tp->next;
          x509_store = (X509_STORE *)&tp[-2].next;
          iVar2 = memcmp(&client_CA,&tp[-2].owner,(ulong)local_6c);
          if (iVar2 == 0) {
            *(int *)(x509_store + 0x40) = *(int *)(x509_store + 0x40) + 1;
            info_local->server_ssl_cert_mem = *(void **)x509_store;
            _lws_log(8,"%s: vh %s: reusing client ctx %d: use %d\n",
                     "lws_tls_client_create_vhost_context",
                     *(undefined8 *)&info_local->simultaneous_ssl_restriction,
                     (ulong)*(uint *)(x509_store + 0x44),(ulong)*(uint *)(x509_store + 0x40));
            return 0;
          }
          tp = (lws_dll2 *)amount;
        }
        piVar8 = __errno_location();
        *piVar8 = 0;
        ERR_clear_error();
        pSVar9 = SSL_CTX_new((SSL_METHOD *)mdctx);
        info_local->server_ssl_cert_mem = pSVar9;
        if (info_local->server_ssl_cert_mem == (void *)0x0) {
          pSVar4 = (SSL_METHOD *)ERR_get_error();
          method = pSVar4;
          pcVar5 = ERR_error_string((ulong)pSVar4,
                                    *(char **)((long)info_local->client_ssl_ca_mem + 0x2a8));
          _lws_log(1,"problem creating ssl context %lu: %s\n",pSVar4,pcVar5);
          vh_local._4_4_ = 1;
        }
        else {
          x509_store = (X509_STORE *)lws_zalloc(0x48,"client ctx tcr");
          if (x509_store == (X509_STORE *)0x0) {
            SSL_CTX_free((SSL_CTX *)info_local->server_ssl_cert_mem);
            vh_local._4_4_ = 1;
          }
          else {
            *(void **)x509_store = info_local->server_ssl_cert_mem;
            *(undefined4 *)(x509_store + 0x40) = 1;
            memcpy(x509_store + 8,&client_CA,(ulong)local_6c);
            iVar2 = *(int *)((long)info_local->client_ssl_ca_mem + 0x3b8);
            *(int *)((long)info_local->client_ssl_ca_mem + 0x3b8) = iVar2 + 1;
            *(int *)(x509_store + 0x44) = iVar2;
            lws_dll2_add_head((lws_dll2 *)(x509_store + 0x28),
                              (lws_dll2_owner *)((long)info_local->client_ssl_ca_mem + 0x3a0));
            _lws_log(8,"%s: vh %s: created new client ctx %d\n",
                     "lws_tls_client_create_vhost_context",
                     *(undefined8 *)&info_local->simultaneous_ssl_restriction,
                     (ulong)*(uint *)(x509_store + 0x44));
            SSL_CTX_set_ex_data((SSL_CTX *)info_local->server_ssl_cert_mem,
                                openssl_SSL_CTX_private_data_index,x509_store);
            SSL_CTX_set_options(info_local->server_ssl_cert_mem,0x20000);
            SSL_CTX_set_options(info_local->server_ssl_cert_mem,0x400000);
            SSL_CTX_ctrl((SSL_CTX *)info_local->server_ssl_cert_mem,0x21,0x12,(void *)0x0);
            if (*(long *)(cipher_list_local + 0x1e8) != 0) {
              SSL_CTX_set_options(info_local->server_ssl_cert_mem,
                                  *(undefined8 *)(cipher_list_local + 0x1e8));
            }
            if (*(long *)(cipher_list_local + 0x1f0) != 0) {
              SSL_CTX_clear_options
                        (info_local->server_ssl_cert_mem,*(undefined8 *)(cipher_list_local + 0x1f0))
              ;
            }
            if (ca_filepath_local != (char *)0x0) {
              SSL_CTX_set_cipher_list((SSL_CTX *)info_local->server_ssl_cert_mem,ca_filepath_local);
            }
            if (*(long *)(cipher_list_local + 0x200) != 0) {
              SSL_CTX_set_ciphersuites
                        (info_local->server_ssl_cert_mem,*(undefined8 *)(cipher_list_local + 0x200))
              ;
            }
            if (((ulong)info_local->client_ssl_ca_filepath & 0x40) != 0x40) {
              SSL_CTX_set_default_verify_paths((SSL_CTX *)info_local->server_ssl_cert_mem);
            }
            if ((ca_mem_local == (void *)0x0) && ((pcStack_38 == (char *)0x0 || (tcr._4_4_ == 0))))
            {
              iVar2 = SSL_CTX_load_verify_locations
                                ((SSL_CTX *)info_local->server_ssl_cert_mem,(char *)0x0,"../share");
              if (iVar2 == 0) {
                _lws_log(1,
                         "Unable to load SSL Client certs from %s (set by LWS_OPENSSL_CLIENT_CERTS) -- client ssl isn\'t going to work\n"
                         ,"../share");
              }
            }
            else if (ca_mem_local == (void *)0x0) {
              up1 = (uint8_t *)0x0;
              iVar2 = lws_tls_alloc_pem_to_der_file
                                ((lws_context *)info_local->client_ssl_ca_mem,(char *)0x0,pcStack_38
                                 ,(ulong)tcr._4_4_,&up,(lws_filepos_t *)&up1);
              if (iVar2 != 0) {
                _lws_log(1,"%s: Unable to decode x.509 mem\n","lws_tls_client_create_vhost_context")
                ;
                lwsl_hexdump_level(4,pcStack_38,(ulong)tcr._4_4_);
                return 1;
              }
              local_d0 = up;
              _n = d2i_X509((X509 **)0x0,&local_d0,(long)up1);
              if (_n == (X509 *)0x0) {
                _lws_log(1,"%s: d2i_X509 failed\n","lws_tls_client_create_vhost_context");
                lwsl_hexdump_level(4,up,(size_t)up1);
                lws_tls_err_describe_clear();
              }
              else {
                error = (unsigned_long)X509_STORE_new();
                iVar2 = X509_STORE_add_cert((X509_STORE *)error,_n);
                if (iVar2 == 0) {
                  X509_STORE_free((X509_STORE *)error);
                  _lws_log(1,
                           "Unable to load SSL Client certs from ssl_ca_mem -- client ssl isn\'t going to work\n"
                          );
                  lws_tls_err_describe_clear();
                }
                else {
                  SSL_CTX_set_cert_store
                            ((SSL_CTX *)info_local->server_ssl_cert_mem,(X509_STORE *)error);
                  _lws_log(8,"loaded ssl_ca_mem\n");
                }
              }
              if (_n != (X509 *)0x0) {
                X509_free(_n);
              }
              lws_realloc(up,0,"lws_free");
            }
            else {
              iVar2 = SSL_CTX_load_verify_locations
                                ((SSL_CTX *)info_local->server_ssl_cert_mem,(char *)ca_mem_local,
                                 (char *)0x0);
              if (iVar2 == 0) {
                _lws_log(1,
                         "Unable to load SSL Client certs file from %s -- client ssl isn\'t going to work\n"
                         ,ca_mem_local);
                lws_tls_err_describe_clear();
              }
              else {
                _lws_log(8,"loaded ssl_ca_filepath\n");
              }
            }
            if (cert_filepath == (char *)0x0) {
              if (((cert_mem != (void *)0x0) && (cert_mem_len != 0)) &&
                 (p._0_4_ = SSL_CTX_use_certificate_ASN1
                                      ((SSL_CTX *)info_local->server_ssl_cert_mem,cert_mem_len,
                                       (uchar *)cert_mem), (int)(uint)p < 1)) {
                _lws_log(1,"%s: problem interpreting client cert\n",
                         "lws_tls_client_create_vhost_context");
                lws_tls_err_describe_clear();
                return 1;
              }
            }
            else {
              lVar3 = lws_tls_use_any_upgrade_check_extant(cert_filepath);
              if ((lVar3 != LWS_TLS_EXTANT_YES) &&
                 ((*(ulong *)(cipher_list_local + 0x68) & 0x4000000) != 0)) {
                return 0;
              }
              _lws_log(4,"%s: doing cert filepath %s\n","lws_tls_client_create_vhost_context",
                       cert_filepath);
              p._0_4_ = SSL_CTX_use_certificate_chain_file
                                  ((SSL_CTX *)info_local->server_ssl_cert_mem,cert_filepath);
              if ((int)(uint)p < 1) {
                _lws_log(1,"problem %d getting cert \'%s\'\n",(ulong)(uint)p,cert_filepath);
                lws_tls_err_describe_clear();
                return 1;
              }
              _lws_log(4,"Loaded client cert %s\n",cert_filepath);
            }
            if (private_key_filepath != (char *)0x0) {
              _lws_log(4,"%s: doing private key filepath\n","lws_tls_client_create_vhost_context");
              lws_ssl_bind_passphrase
                        ((SSL_CTX *)info_local->server_ssl_cert_mem,1,
                         (lws_context_creation_info *)cipher_list_local);
              iVar2 = SSL_CTX_use_PrivateKey_file
                                ((SSL_CTX *)info_local->server_ssl_cert_mem,private_key_filepath,1);
              if (iVar2 != 1) {
                _lws_log(1,"use_PrivateKey_file \'%s\'\n",private_key_filepath);
                lws_tls_err_describe_clear();
                return 1;
              }
              _lws_log(4,"Loaded client cert private key %s\n",private_key_filepath);
              iVar2 = SSL_CTX_check_private_key((SSL_CTX *)info_local->server_ssl_cert_mem);
              if (iVar2 == 0) {
                _lws_log(1,"Private SSL key doesn\'t match cert\n");
                return 1;
              }
            }
            vh_local._4_4_ = 0;
          }
        }
      }
      else {
        EVP_MD_CTX_free(pEStack_68);
        vh_local._4_4_ = 1;
      }
    }
  }
  return vh_local._4_4_;
}

Assistant:

int
lws_tls_client_create_vhost_context(struct lws_vhost *vh,
				    const struct lws_context_creation_info *info,
				    const char *cipher_list,
				    const char *ca_filepath,
				    const void *ca_mem,
				    unsigned int ca_mem_len,
				    const char *cert_filepath,
				    const void *cert_mem,
				    unsigned int cert_mem_len,
				    const char *private_key_filepath)
{
	struct lws_tls_client_reuse *tcr;
	X509_STORE *x509_store;
	unsigned long error;
	SSL_METHOD *method;
	EVP_MD_CTX *mdctx;
	unsigned int len;
	uint8_t hash[32];
	X509 *client_CA;
	char c;
	int n;

	/* basic openssl init already happened in context init */

	/* choose the most recent spin of the api */
#if defined(LWS_HAVE_TLS_CLIENT_METHOD)
	method = (SSL_METHOD *)TLS_client_method();
#elif defined(LWS_HAVE_TLSV1_2_CLIENT_METHOD)
	method = (SSL_METHOD *)TLSv1_2_client_method();
#else
	method = (SSL_METHOD *)SSLv23_client_method();
#endif

	if (!method) {
		error = ERR_get_error();
		lwsl_err("problem creating ssl method %lu: %s\n",
			error, ERR_error_string(error,
				      (char *)vh->context->pt[0].serv_buf));
		return 1;
	}

	/*
	 * OpenSSL client contexts are quite expensive, because they bring in
	 * the system certificate bundle for each one.  So if you have multiple
	 * vhosts, each with a client context, it can add up to several
	 * megabytes of heap.  In the case the client contexts are configured
	 * identically, they could perfectly well have shared just the one.
	 *
	 * For that reason, use a hash to fingerprint the context configuration
	 * and prefer to reuse an existing one with the same fingerprint if
	 * possible.
	 */

	 mdctx = EVP_MD_CTX_create();
	 if (!mdctx)
		 return 1;

	if (EVP_DigestInit_ex(mdctx, EVP_sha256(), NULL) != 1) {
		EVP_MD_CTX_destroy(mdctx);

		return 1;
	}

	if (info->ssl_client_options_set)
		EVP_DigestUpdate(mdctx, &info->ssl_client_options_set,
				 sizeof(info->ssl_client_options_set));

#if (OPENSSL_VERSION_NUMBER >= 0x009080df) && !defined(USE_WOLFSSL)
	if (info->ssl_client_options_clear)
		EVP_DigestUpdate(mdctx, &info->ssl_client_options_clear,
				 sizeof(info->ssl_client_options_clear));
#endif

	if (cipher_list)
		EVP_DigestUpdate(mdctx, cipher_list, strlen(cipher_list));

#if defined(LWS_HAVE_SSL_CTX_set_ciphersuites)
	if (info->client_tls_1_3_plus_cipher_list)
		EVP_DigestUpdate(mdctx, info->client_tls_1_3_plus_cipher_list,
				 strlen(info->client_tls_1_3_plus_cipher_list));
#endif

	if (!lws_check_opt(vh->options, LWS_SERVER_OPTION_DISABLE_OS_CA_CERTS)) {
		c = 1;
		EVP_DigestUpdate(mdctx, &c, 1);
	}

	if (ca_filepath)
		EVP_DigestUpdate(mdctx, ca_filepath, strlen(ca_filepath));

	if (cert_filepath)
		EVP_DigestUpdate(mdctx, cert_filepath, strlen(cert_filepath));

	if (private_key_filepath)
		EVP_DigestUpdate(mdctx, private_key_filepath,
				 strlen(private_key_filepath));
	if (ca_mem && ca_mem_len)
		EVP_DigestUpdate(mdctx, ca_mem, ca_mem_len);

	if (cert_mem && cert_mem_len)
		EVP_DigestUpdate(mdctx, cert_mem, cert_mem_len);

	len = sizeof(hash);
	EVP_DigestFinal_ex(mdctx, hash, &len);
	EVP_MD_CTX_destroy(mdctx);

	/* look for existing client context with same config already */

	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
			 lws_dll2_get_head(&vh->context->tls.cc_owner)) {
		tcr = lws_container_of(p, struct lws_tls_client_reuse, cc_list);

		if (!memcmp(hash, tcr->hash, len)) {

			/* it's a match */

			tcr->refcount++;
			vh->tls.ssl_client_ctx = tcr->ssl_client_ctx;

			lwsl_info("%s: vh %s: reusing client ctx %d: use %d\n",
				   __func__, vh->name, tcr->index,
				   tcr->refcount);

			return 0;
		}
	} lws_end_foreach_dll_safe(p, tp);

	/* no existing one the same... create new client SSL_CTX */

	errno = 0;
	ERR_clear_error();
	vh->tls.ssl_client_ctx = SSL_CTX_new(method);
	if (!vh->tls.ssl_client_ctx) {
		error = ERR_get_error();
		lwsl_err("problem creating ssl context %lu: %s\n",
			error, ERR_error_string(error,
				      (char *)vh->context->pt[0].serv_buf));
		return 1;
	}

	tcr = lws_zalloc(sizeof(*tcr), "client ctx tcr");
	if (!tcr) {
		SSL_CTX_free(vh->tls.ssl_client_ctx);
		return 1;
	}

	tcr->ssl_client_ctx = vh->tls.ssl_client_ctx;
	tcr->refcount = 1;
	memcpy(tcr->hash, hash, len);
	tcr->index = vh->context->tls.count_client_contexts++;
	lws_dll2_add_head(&tcr->cc_list, &vh->context->tls.cc_owner);

	lwsl_info("%s: vh %s: created new client ctx %d\n", __func__,
			vh->name, tcr->index);

	/* bind the tcr to the client context */

	SSL_CTX_set_ex_data(vh->tls.ssl_client_ctx,
			    openssl_SSL_CTX_private_data_index,
			    (char *)tcr);

#ifdef SSL_OP_NO_COMPRESSION
	SSL_CTX_set_options(vh->tls.ssl_client_ctx, SSL_OP_NO_COMPRESSION);
#endif

	SSL_CTX_set_options(vh->tls.ssl_client_ctx,
			    SSL_OP_CIPHER_SERVER_PREFERENCE);

	SSL_CTX_set_mode(vh->tls.ssl_client_ctx,
			 SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER |
			 SSL_MODE_RELEASE_BUFFERS);

	if (info->ssl_client_options_set)
		SSL_CTX_set_options(vh->tls.ssl_client_ctx,
				    info->ssl_client_options_set);

	/* SSL_clear_options introduced in 0.9.8m */
#if (OPENSSL_VERSION_NUMBER >= 0x009080df) && !defined(USE_WOLFSSL)
	if (info->ssl_client_options_clear)
		SSL_CTX_clear_options(vh->tls.ssl_client_ctx,
				      info->ssl_client_options_clear);
#endif

	if (cipher_list)
		SSL_CTX_set_cipher_list(vh->tls.ssl_client_ctx, cipher_list);

#if defined(LWS_HAVE_SSL_CTX_set_ciphersuites)
	if (info->client_tls_1_3_plus_cipher_list)
		SSL_CTX_set_ciphersuites(vh->tls.ssl_client_ctx,
					 info->client_tls_1_3_plus_cipher_list);
#endif

#ifdef LWS_SSL_CLIENT_USE_OS_CA_CERTS
	if (!lws_check_opt(vh->options, LWS_SERVER_OPTION_DISABLE_OS_CA_CERTS))
		/* loads OS default CA certs */
		SSL_CTX_set_default_verify_paths(vh->tls.ssl_client_ctx);
#endif

	/* openssl init for cert verification (for client sockets) */
	if (!ca_filepath && (!ca_mem || !ca_mem_len)) {
		if (!SSL_CTX_load_verify_locations(
			vh->tls.ssl_client_ctx, NULL, LWS_OPENSSL_CLIENT_CERTS))
			lwsl_err("Unable to load SSL Client certs from %s "
			    "(set by LWS_OPENSSL_CLIENT_CERTS) -- "
			    "client ssl isn't going to work\n",
			    LWS_OPENSSL_CLIENT_CERTS);
	} else if (ca_filepath) {
		if (!SSL_CTX_load_verify_locations(
			vh->tls.ssl_client_ctx, ca_filepath, NULL)) {
			lwsl_err(
				"Unable to load SSL Client certs "
				"file from %s -- client ssl isn't "
				"going to work\n", ca_filepath);
			lws_tls_err_describe_clear();
		}
		else
			lwsl_info("loaded ssl_ca_filepath\n");
	} else {

		lws_filepos_t amount = 0;
		uint8_t *up1;
		const uint8_t *up;

		if (lws_tls_alloc_pem_to_der_file(vh->context, NULL, ca_mem,
						  ca_mem_len, &up1,
						  &amount)) {
			lwsl_err("%s: Unable to decode x.509 mem\n", __func__);
			lwsl_hexdump_notice(ca_mem, ca_mem_len);
			return 1;
		}

		up = up1;
		client_CA = d2i_X509(NULL, &up, (long)amount);
		if (!client_CA) {
			lwsl_err("%s: d2i_X509 failed\n", __func__);
			lwsl_hexdump_notice(up1, (size_t)amount);
			lws_tls_err_describe_clear();
		} else {
			x509_store = X509_STORE_new();
			if (!X509_STORE_add_cert(x509_store, client_CA)) {
				X509_STORE_free(x509_store);
				lwsl_err("Unable to load SSL Client certs from "
					 "ssl_ca_mem -- client ssl isn't going to "
					 "work\n");
				lws_tls_err_describe_clear();
			} else {
				/* it doesn't increment x509_store ref counter */
				SSL_CTX_set_cert_store(vh->tls.ssl_client_ctx,
						       x509_store);
				lwsl_info("loaded ssl_ca_mem\n");
			}
		}
		if (client_CA)
			X509_free(client_CA);
		lws_free(up1);
	//	lws_tls_client_vhost_extra_cert_mem(vh, ca_mem, ca_mem_len);
	}

	/*
	 * callback allowing user code to load extra verification certs
	 * helping the client to verify server identity
	 */

	/* support for client-side certificate authentication */
	if (cert_filepath) {
		if (lws_tls_use_any_upgrade_check_extant(cert_filepath) !=
				LWS_TLS_EXTANT_YES &&
		    (info->options & LWS_SERVER_OPTION_IGNORE_MISSING_CERT))
			return 0;

		lwsl_notice("%s: doing cert filepath %s\n", __func__,
				cert_filepath);
		n = SSL_CTX_use_certificate_chain_file(vh->tls.ssl_client_ctx,
						       cert_filepath);
		if (n < 1) {
			lwsl_err("problem %d getting cert '%s'\n", n,
				 cert_filepath);
			lws_tls_err_describe_clear();
			return 1;
		}
		lwsl_notice("Loaded client cert %s\n", cert_filepath);
	} else if (cert_mem && cert_mem_len) {
		n = SSL_CTX_use_certificate_ASN1(vh->tls.ssl_client_ctx,
						 cert_mem_len, cert_mem);
		if (n < 1) {
			lwsl_err("%s: problem interpreting client cert\n",
				 __func__);
			lws_tls_err_describe_clear();
			return 1;
		}
	}
	if (private_key_filepath) {
		lwsl_notice("%s: doing private key filepath\n", __func__);
		lws_ssl_bind_passphrase(vh->tls.ssl_client_ctx, 1, info);
		/* set the private key from KeyFile */
		if (SSL_CTX_use_PrivateKey_file(vh->tls.ssl_client_ctx,
		    private_key_filepath, SSL_FILETYPE_PEM) != 1) {
			lwsl_err("use_PrivateKey_file '%s'\n",
				 private_key_filepath);
			lws_tls_err_describe_clear();
			return 1;
		}
		lwsl_notice("Loaded client cert private key %s\n",
			    private_key_filepath);

		/* verify private key */
		if (!SSL_CTX_check_private_key(vh->tls.ssl_client_ctx)) {
			lwsl_err("Private SSL key doesn't match cert\n");
			return 1;
		}
	}

	return 0;
}